

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkAig.c
# Opt level: O1

void Nwk_ManDeriveMinCut(Gia_Man_t *p,int fVerbose)

{
  int *piVar1;
  Vec_Int_t *pVVar2;
  ulong uVar3;
  Vec_Int_t *__ptr;
  int iVar4;
  int iVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  Vec_Int_t *pVVar8;
  Nwk_Man_t *pNtk;
  Vec_Ptr_t *__ptr_00;
  Vec_Int_t *vNodes;
  Vec_Int_t *pVVar9;
  long lVar10;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar11;
  ulong uVar12;
  int *piVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  int *piVar17;
  Vec_Int_t *vPPis;
  Vec_Int_t *vMapInv;
  Vec_Int_t *local_60;
  Vec_Int_t *local_58;
  Vec_Int_t *local_50;
  Vec_Int_t *local_48;
  long local_40;
  Vec_Int_t *local_38;
  
  Gia_ManGlaCollect(p,p->vGateClasses,(Vec_Int_t **)0x0,&local_60,(Vec_Int_t **)0x0,
                    (Vec_Int_t **)0x0);
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 100;
  pVVar6->nSize = 0;
  piVar7 = (int *)malloc(400);
  pVVar6->pArray = piVar7;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nCap = 100;
  pVVar8->nSize = 0;
  piVar7 = (int *)malloc(400);
  pVVar8->pArray = piVar7;
  Gia_ManIncrementTravId(p);
  if (0 < local_60->nSize) {
    lVar16 = 0;
    do {
      iVar4 = local_60->pArray[lVar16];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_008dbdfc;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      Nwk_ManColleacReached_rec(p,p->pObjs + iVar4,pVVar6,pVVar8);
      lVar16 = lVar16 + 1;
    } while (lVar16 < local_60->nSize);
  }
  local_38 = pVVar8;
  pNtk = Nwk_ManCreateFromGia(p,local_60,pVVar6,pVVar8,&local_50);
  iVar4 = Nwk_ManPiNum(pNtk);
  iVar5 = Nwk_ManPoNum(pNtk);
  if (iVar4 != iVar5) {
    __assert_fail("Nwk_ManPiNum(pNtk) == Nwk_ManPoNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkAig.c"
                  ,0xed,"void Nwk_ManDeriveMinCut(Gia_Man_t *, int)");
  }
  iVar4 = Nwk_ManPiNum(pNtk);
  __ptr_00 = Nwk_ManRetimeCutBackward(pNtk,iVar4,fVerbose);
  vNodes = (Vec_Int_t *)malloc(0x10);
  vNodes->nCap = 100;
  vNodes->nSize = 0;
  piVar7 = (int *)malloc(400);
  vNodes->pArray = piVar7;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  pVVar9->nCap = 100;
  pVVar9->nSize = 0;
  piVar7 = (int *)malloc(400);
  pVVar9->pArray = piVar7;
  Gia_ManIncrementTravId(p);
  pVVar8 = local_50;
  uVar12 = (ulong)(uint)__ptr_00->nSize;
  local_58 = pVVar6;
  if (0 < __ptr_00->nSize) {
    lVar16 = 0;
    do {
      iVar4 = *(int *)((long)__ptr_00->pArray[lVar16] + 0x24);
      if (((long)iVar4 < 0) || (pVVar8->nSize <= iVar4)) goto LAB_008dbe1b;
      iVar4 = pVVar8->pArray[iVar4];
      lVar10 = (long)iVar4;
      if ((lVar10 < 0) || (p->nObjs <= iVar4)) {
LAB_008dbdfc:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if ((~*(ulong *)(p->pObjs + lVar10) & 0x1fffffff1fffffff) != 0) {
        Nwk_ManColleacReached_rec(p,p->pObjs + lVar10,vNodes,pVVar9);
      }
      lVar16 = lVar16 + 1;
      uVar12 = (ulong)__ptr_00->nSize;
    } while (lVar16 < (long)uVar12);
  }
  pVVar6 = local_58;
  if (fVerbose != 0) {
    printf("Min-cut: %d -> %d.  Nodes %d -> %d.  ",(ulong)(local_60->nSize + 1),uVar12,
           (ulong)(uint)local_58->nSize,(ulong)(uint)vNodes->nSize);
  }
  if (local_60->pArray != (int *)0x0) {
    free(local_60->pArray);
    local_60->pArray = (int *)0x0;
  }
  if (local_60 != (Vec_Int_t *)0x0) {
    free(local_60);
  }
  if (__ptr_00->pArray != (void **)0x0) {
    free(__ptr_00->pArray);
    __ptr_00->pArray = (void **)0x0;
  }
  if (__ptr_00 != (Vec_Ptr_t *)0x0) {
    free(__ptr_00);
  }
  if (local_50->pArray != (int *)0x0) {
    free(local_50->pArray);
    local_50->pArray = (int *)0x0;
  }
  local_48 = pVVar9;
  if (local_50 != (Vec_Int_t *)0x0) {
    free(local_50);
  }
  Nwk_ManFree(pNtk);
  qsort(pVVar6->pArray,(long)pVVar6->nSize,4,Vec_IntSortCompare1);
  qsort(vNodes->pArray,(long)vNodes->nSize,4,Vec_IntSortCompare1);
  iVar4 = pVVar6->nSize;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar4 - 1U) {
    iVar5 = iVar4;
  }
  pVVar8->nSize = 0;
  pVVar8->nCap = iVar5;
  local_40 = (long)iVar4;
  if (iVar5 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc((long)iVar5 << 2);
  }
  pVVar8->pArray = piVar7;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  pVVar9->nCap = 100;
  pVVar9->nSize = 0;
  piVar7 = (int *)malloc(400);
  pVVar9->pArray = piVar7;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar7 = (int *)malloc(400);
  p_00->pArray = piVar7;
  piVar13 = pVVar6->pArray;
  piVar17 = vNodes->pArray;
  piVar1 = piVar13 + local_40;
  piVar7 = piVar17 + vNodes->nSize;
  if (0 < vNodes->nSize && 0 < (int)local_40) {
    do {
      iVar4 = *piVar13;
      iVar5 = *piVar17;
      if (iVar4 == iVar5) {
        piVar13 = piVar13 + 1;
        Vec_IntPush(pVVar8,iVar4);
        piVar17 = piVar17 + 1;
      }
      else {
        if (iVar4 < iVar5) {
          piVar13 = piVar13 + 1;
          pVVar6 = pVVar9;
          iVar5 = iVar4;
        }
        else {
          piVar17 = piVar17 + 1;
          pVVar6 = p_00;
        }
        Vec_IntPush(pVVar6,iVar5);
      }
    } while ((piVar13 < piVar1) && (piVar17 < piVar7));
  }
  for (; pVVar6 = local_38, piVar13 < piVar1; piVar13 = piVar13 + 1) {
    Vec_IntPush(pVVar9,*piVar13);
  }
  for (; local_38 = pVVar6, piVar17 < piVar7; piVar17 = piVar17 + 1) {
    Vec_IntPush(p_00,*piVar17);
    pVVar6 = local_38;
  }
  if (fVerbose != 0) {
    printf("Common = %d.  Diff0 = %d. Diff1 = %d.\n",(ulong)(uint)pVVar8->nSize,
           (ulong)(uint)pVVar9->nSize,(ulong)(uint)p_00->nSize);
  }
  __ptr = local_58;
  iVar4 = pVVar9->nSize;
  if (0 < (long)iVar4) {
    piVar7 = pVVar9->pArray;
    pVVar2 = p->vGateClasses;
    lVar16 = 0;
    do {
      iVar5 = piVar7[lVar16];
      if (((long)iVar5 < 0) || (pVVar2->nSize <= iVar5)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      pVVar2->pArray[iVar5] = 1;
      lVar16 = lVar16 + 1;
    } while (iVar4 != lVar16);
  }
  if (pVVar6->pArray != (int *)0x0) {
    free(pVVar6->pArray);
    pVVar6->pArray = (int *)0x0;
  }
  free(pVVar6);
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  free(__ptr);
  pVVar6 = local_48;
  if (local_48->pArray != (int *)0x0) {
    free(local_48->pArray);
    pVVar6->pArray = (int *)0x0;
  }
  free(pVVar6);
  if (vNodes->pArray != (int *)0x0) {
    free(vNodes->pArray);
    vNodes->pArray = (int *)0x0;
  }
  free(vNodes);
  if (pVVar8->pArray != (int *)0x0) {
    free(pVVar8->pArray);
    pVVar8->pArray = (int *)0x0;
  }
  free(pVVar8);
  if (pVVar9->pArray != (int *)0x0) {
    free(pVVar9->pArray);
    pVVar9->pArray = (int *)0x0;
  }
  free(pVVar9);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  if ((0 < p->nObjs) && (pGVar11 = p->pObjs, pGVar11 != (Gia_Obj_t *)0x0)) {
    uVar15 = p->vGateClasses->nSize;
    uVar14 = 0;
    uVar12 = (ulong)uVar15;
    if ((int)uVar15 < 1) {
      uVar12 = uVar14;
    }
    do {
      if (uVar12 == uVar14) {
LAB_008dbe1b:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if ((((p->vGateClasses->pArray[uVar14] != 0) &&
           (uVar3 = *(ulong *)pGVar11, (~uVar3 & 0x1fffffff1fffffff) != 0)) &&
          ((uVar15 = (uint)uVar3, (~uVar15 & 0x9fffffff) != 0 ||
           ((int)((uint)(uVar3 >> 0x20) & 0x1fffffff) < p->vCis->nSize - p->nRegs)))) &&
         (((int)uVar15 < 0 || ((uVar15 & 0x1fffffff) == 0x1fffffff)))) {
        __assert_fail("Gia_ObjIsConst0(pObj) || Gia_ObjIsRo(p, pObj) || Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkAig.c"
                      ,0x121,"void Nwk_ManDeriveMinCut(Gia_Man_t *, int)");
      }
      uVar14 = uVar14 + 1;
      pGVar11 = pGVar11 + 1;
    } while ((uint)p->nObjs != uVar14);
  }
  return;
}

Assistant:

void Nwk_ManDeriveMinCut( Gia_Man_t * p, int fVerbose )
{
    Nwk_Man_t * pNtk;
    Nwk_Obj_t * pNode;
    Vec_Ptr_t * vMinCut;
    Vec_Int_t * vPPis, * vNodes, * vLeaves, * vNodes2, * vLeaves2, * vMapInv;
    Vec_Int_t * vCommon, * vDiff0, * vDiff1;
    Gia_Obj_t * pObj;
    int i, iObjId;
    // get inputs
    Gia_ManGlaCollect( p, p->vGateClasses, NULL, &vPPis, NULL, NULL );
    // collect nodes rechable from PPIs
    vNodes = Vec_IntAlloc( 100 );
    vLeaves = Vec_IntAlloc( 100 );
    Gia_ManIncrementTravId( p );
    Gia_ManForEachObjVec( vPPis, p, pObj, i )
        Nwk_ManColleacReached_rec( p, pObj, vNodes, vLeaves );
    // derive the new network
    pNtk = Nwk_ManCreateFromGia( p, vPPis, vNodes, vLeaves, &vMapInv );
    assert( Nwk_ManPiNum(pNtk) == Nwk_ManPoNum(pNtk) );
    // create min-cut
    vMinCut = Nwk_ManRetimeCutBackward( pNtk, Nwk_ManPiNum(pNtk), fVerbose );
    // copy from the GIA back
//    Aig_ManForEachObj( p, pObj, i )
//        ((Nwk_Obj_t *)pObj->pData)->pCopy = pObj;
    // mark min-cut nodes
    vNodes2 = Vec_IntAlloc( 100 );
    vLeaves2 = Vec_IntAlloc( 100 );
    Gia_ManIncrementTravId( p );
    Vec_PtrForEachEntry( Nwk_Obj_t *, vMinCut, pNode, i )
    {
        pObj = Gia_ManObj( p, Vec_IntEntry(vMapInv, Nwk_ObjId(pNode)) );
        if ( Gia_ObjIsConst0(pObj) )
            continue;
        Nwk_ManColleacReached_rec( p, pObj, vNodes2, vLeaves2 );
    }
    if ( fVerbose )
        printf( "Min-cut: %d -> %d.  Nodes %d -> %d.  ", Vec_IntSize(vPPis)+1, Vec_PtrSize(vMinCut), Vec_IntSize(vNodes), Vec_IntSize(vNodes2) );
    Vec_IntFree( vPPis );
    Vec_PtrFree( vMinCut );
    Vec_IntFree( vMapInv );
    Nwk_ManFree( pNtk );

    // sort the results
    Vec_IntSort( vNodes, 0 );
    Vec_IntSort( vNodes2, 0 );
    vCommon = Vec_IntAlloc( Vec_IntSize(vNodes) );
    vDiff0 = Vec_IntAlloc( 100 );
    vDiff1 = Vec_IntAlloc( 100 );
    Vec_IntTwoSplit( vNodes, vNodes2, vCommon, vDiff0, vDiff1 );
    if ( fVerbose )
        printf( "Common = %d.  Diff0 = %d. Diff1 = %d.\n", Vec_IntSize(vCommon), Vec_IntSize(vDiff0), Vec_IntSize(vDiff1) );

    // fill in
    Vec_IntForEachEntry( vDiff0, iObjId, i )
        Vec_IntWriteEntry( p->vGateClasses, iObjId, 1 );

    Vec_IntFree( vLeaves );
    Vec_IntFree( vNodes );
    Vec_IntFree( vLeaves2 );
    Vec_IntFree( vNodes2 );

    Vec_IntFree( vCommon );
    Vec_IntFree( vDiff0 );
    Vec_IntFree( vDiff1 );

    // check abstraction
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Vec_IntEntry( p->vGateClasses, i ) == 0 )
            continue;
        assert( Gia_ObjIsConst0(pObj) || Gia_ObjIsRo(p, pObj) || Gia_ObjIsAnd(pObj) );
    }
}